

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fttrigon.c
# Opt level: O1

void FT_Vector_Rotate(FT_Vector *vec,FT_Angle angle)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar8;
  int iVar9;
  FT_Vector v;
  FT_Vector local_28;
  long lVar7;
  
  if (angle != 0 && vec != (FT_Vector *)0x0) {
    local_28.x = vec->x;
    local_28.y = vec->y;
    if (local_28.x != 0 || local_28.y != 0) {
      lVar3 = -local_28.x;
      if (0 < local_28.x) {
        lVar3 = local_28.x;
      }
      lVar7 = -local_28.y;
      if (0 < local_28.y) {
        lVar7 = local_28.y;
      }
      uVar6 = (uint)lVar7 | (uint)lVar3;
      uVar1 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      if (uVar1 < 0x1e) {
        iVar9 = 0x1d - uVar1;
        local_28.x = local_28.x << ((byte)iVar9 & 0x3f);
        local_28.y = local_28.y << ((byte)iVar9 & 0x3f);
      }
      else {
        iVar9 = (uVar1 ^ 0x1f) - 2;
        bVar4 = 2 - (char)(uVar1 ^ 0x1f);
        local_28.x = local_28.x >> (bVar4 & 0x3f);
        local_28.y = local_28.y >> (bVar4 & 0x3f);
      }
      ft_trig_pseudo_rotate(&local_28,angle);
      lVar3 = -local_28.x;
      if (0 < local_28.x) {
        lVar3 = local_28.x;
      }
      uVar5 = lVar3 * 0xdbd95b16 + 0x40000000U >> 0x20;
      uVar2 = -uVar5;
      if (-1 < local_28.x) {
        uVar2 = uVar5;
      }
      lVar3 = -local_28.y;
      if (0 < local_28.y) {
        lVar3 = local_28.y;
      }
      uVar8 = lVar3 * 0xdbd95b16 + 0x40000000U >> 0x20;
      uVar5 = -uVar8;
      if (-1 < local_28.y) {
        uVar5 = uVar8;
      }
      bVar4 = (byte)iVar9;
      if (iVar9 < 1) {
        vec->x = uVar2 << (-bVar4 & 0x3f);
        lVar3 = uVar5 << (-bVar4 & 0x3f);
      }
      else {
        uVar8 = (ulong)(uint)(1 << (bVar4 - 1 & 0x1f));
        vec->x = (long)(((long)uVar2 >> 0x3f) + uVar2 + uVar8) >> (bVar4 & 0x3f);
        lVar3 = (long)(((long)uVar5 >> 0x3f) + uVar5 + uVar8) >> (bVar4 & 0x3f);
      }
      vec->y = lVar3;
    }
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Vector_Rotate( FT_Vector*  vec,
                    FT_Angle    angle )
  {
    FT_Int     shift;
    FT_Vector  v;


    if ( !vec || !angle )
      return;

    v = *vec;

    if ( v.x == 0 && v.y == 0 )
      return;

    shift = ft_trig_prenorm( &v );
    ft_trig_pseudo_rotate( &v, angle );
    v.x = ft_trig_downscale( v.x );
    v.y = ft_trig_downscale( v.y );

    if ( shift > 0 )
    {
      FT_Int32  half = (FT_Int32)1L << ( shift - 1 );


      vec->x = ( v.x + half + FT_SIGN_LONG( v.x ) ) >> shift;
      vec->y = ( v.y + half + FT_SIGN_LONG( v.y ) ) >> shift;
    }
    else
    {
      shift  = -shift;
      vec->x = (FT_Pos)( (FT_ULong)v.x << shift );
      vec->y = (FT_Pos)( (FT_ULong)v.y << shift );
    }
  }